

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Chapter::Clear(Chapter *this)

{
  uint uVar1;
  char **dst;
  
  if (this->id_ != (char *)0x0) {
    operator_delete__(this->id_);
  }
  this->id_ = (char *)0x0;
  while (0 < this->displays_count_) {
    uVar1 = this->displays_count_ - 1;
    this->displays_count_ = uVar1;
    Display::Clear(this->displays_ + uVar1);
  }
  if (this->displays_ != (Display *)0x0) {
    operator_delete__(this->displays_);
  }
  this->displays_ = (Display *)0x0;
  this->displays_size_ = 0;
  return;
}

Assistant:

void Chapter::Clear() {
  StrCpy(NULL, &id_);

  while (displays_count_ > 0) {
    Display& d = displays_[--displays_count_];
    d.Clear();
  }

  delete[] displays_;
  displays_ = NULL;

  displays_size_ = 0;
}